

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void FindLinks(lemon *lemp)

{
  int iVar1;
  state **ppsVar2;
  state *psVar3;
  config *pcVar4;
  ulong uVar5;
  plink *ppVar6;
  ulong uVar7;
  config *pcVar8;
  plink *ppVar9;
  long lVar10;
  
  iVar1 = lemp->nstate;
  uVar5 = (ulong)iVar1;
  if (0 < (long)uVar5) {
    ppsVar2 = lemp->sorted;
    uVar7 = 0;
    do {
      psVar3 = ppsVar2[uVar7];
      if (psVar3 != (state *)0x0) {
        for (pcVar8 = psVar3->cfp; pcVar8 != (config *)0x0; pcVar8 = pcVar8->next) {
          pcVar8->stp = psVar3;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar5);
    if (0 < iVar1) {
      lVar10 = 0;
      do {
        if ((lemp->sorted[lVar10] != (state *)0x0) &&
           (pcVar8 = lemp->sorted[lVar10]->cfp, pcVar8 != (config *)0x0)) {
          do {
            for (ppVar9 = pcVar8->bplp; ppVar9 != (plink *)0x0; ppVar9 = ppVar9->next) {
              pcVar4 = ppVar9->cfp;
              ppVar6 = Plink_new();
              ppVar6->next = pcVar4->fplp;
              pcVar4->fplp = ppVar6;
              ppVar6->cfp = pcVar8;
            }
            pcVar8 = pcVar8->next;
          } while (pcVar8 != (config *)0x0);
          uVar5 = (ulong)(uint)lemp->nstate;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < (int)uVar5);
    }
  }
  return;
}

Assistant:

void FindLinks(struct lemon *lemp)
{
  int i;
  struct config *cfp, *other;
  struct state *stp;
  struct plink *plp;

  /* Housekeeping detail:
  ** Add to every propagate link a pointer back to the state to
  ** which the link is attached. */
  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    for(cfp=stp?stp->cfp:0; cfp; cfp=cfp->next){
      cfp->stp = stp;
    }
  }

  /* Convert all backlinks into forward links.  Only the forward
  ** links are used in the follow-set computation. */
  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    for(cfp=stp?stp->cfp:0; cfp; cfp=cfp->next){
      for(plp=cfp->bplp; plp; plp=plp->next){
        other = plp->cfp;
        Plink_add(&other->fplp,cfp);
      }
    }
  }
}